

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_collect_pit_stats(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_78 [8];
  char s [80];
  wchar_t local_1c;
  wchar_t local_18;
  wchar_t pittype;
  wchar_t depth;
  wchar_t nsim;
  command_conflict *cmd_local;
  
  _depth = cmd;
  _Var1 = stats_are_enabled();
  if (_Var1) {
    wVar2 = cmd_get_arg_number((command *)_depth,"quantity",&pittype);
    if (wVar2 != L'\0') {
      strnfmt(local_78,0x50,"%d",1000);
      _Var1 = get_string("Number of simulations: ",local_78,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_78,&pittype);
      if (!_Var1) {
        return;
      }
      if (pittype < L'\x01') {
        return;
      }
      cmd_set_arg_number((command *)_depth,"quantity",pittype);
    }
    wVar2 = cmd_get_arg_choice((command *)_depth,"choice",&local_1c);
    if (wVar2 != L'\0') {
      strnfmt(local_78,0x50,"%d",1);
      _Var1 = get_string("Pit type (1-3): ",local_78,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_78,&local_1c);
      if (!_Var1) {
        return;
      }
      if (local_1c < L'\x01') {
        return;
      }
      if (L'\x03' < local_1c) {
        return;
      }
      cmd_set_arg_choice((command *)_depth,"choice",local_1c);
    }
    wVar2 = cmd_get_arg_number((command *)_depth,"depth",&local_18);
    if (wVar2 != L'\0') {
      strnfmt(local_78,0x50,"%d",(ulong)(uint)(int)player->depth);
      _Var1 = get_string("Depth: ",local_78,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_78,&local_18);
      if (!_Var1) {
        return;
      }
      if (local_18 < L'\x01') {
        return;
      }
      cmd_set_arg_number((command *)_depth,"depth",local_18);
    }
    pit_stats(pittype,local_1c,local_18);
  }
  return;
}

Assistant:

void do_cmd_wiz_collect_pit_stats(struct command *cmd)
{
	int nsim, depth, pittype;
	char s[80];

	if (!stats_are_enabled()) return;

	if (cmd_get_arg_number(cmd, "quantity", &nsim) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", 1000);

		if (!get_string("Number of simulations: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &nsim) || nsim < 1) return;
		cmd_set_arg_number(cmd, "quantity", nsim);
	}

	if (cmd_get_arg_choice(cmd, "choice", &pittype) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", 1);

		if (!get_string("Pit type (1-3): ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &pittype) || pittype < 1 ||
			pittype > 3) return;
		cmd_set_arg_choice(cmd, "choice", pittype);
	}

	if (cmd_get_arg_number(cmd, "depth", &depth) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", player->depth);

		if (!get_string("Depth: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &depth) || depth < 1) return;
		cmd_set_arg_number(cmd, "depth", depth);
	}

	pit_stats(nsim, pittype, depth);
}